

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdns.c
# Opt level: O3

int mdns_socket_open_ipv6(void)

{
  int sock;
  int iVar1;
  int iVar2;
  
  sock = socket(10,2,0x11);
  iVar2 = -1;
  if ((-1 < sock) && (iVar1 = mdns_socket_setup_ipv6(sock), iVar2 = sock, iVar1 != 0)) {
    close(sock);
    iVar2 = -1;
  }
  return iVar2;
}

Assistant:

int
mdns_socket_open_ipv6(void) {
	int sock = (int)socket(AF_INET6, SOCK_DGRAM, IPPROTO_UDP);
	if (sock < 0)
		return -1;
	if (mdns_socket_setup_ipv6(sock)) {
		mdns_socket_close(sock);
		return -1;
	}
	return sock;
}